

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv.h
# Opt level: O0

uv_os_fd_t uv_convert_fd_to_handle(int fd)

{
  int fd_local;
  
  return fd;
}

Assistant:

static INLINE uv_os_fd_t uv_convert_fd_to_handle(int fd) {
#ifdef _WIN32
  HANDLE new_handle;
  if (!DuplicateHandle(GetCurrentProcess(), (HANDLE) _get_osfhandle(fd),
                       GetCurrentProcess(), &new_handle,
                       0, FALSE, DUPLICATE_SAME_ACCESS)) {
    return INVALID_HANDLE_VALUE;
  }
  _close(fd);
  return new_handle;
#else
  return fd;
#endif
}